

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_ncons.cc
# Opt level: O2

int do_i2r_name_constraints
              (X509V3_EXT_METHOD *method,stack_st_GENERAL_SUBTREE *trees,BIO *bp,int ind,char *name)

{
  ushort uVar1;
  GENERAL_NAME *gen;
  ASN1_STRING *pAVar2;
  size_t sVar3;
  undefined8 *puVar4;
  undefined4 in_register_0000000c;
  char *buf;
  ulong i;
  int iVar5;
  long lVar6;
  
  sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)method);
  if (sVar3 != 0) {
    BIO_printf((BIO *)trees,"%*s%s:\n",(ulong)bp & 0xffffffff,"",CONCAT44(in_register_0000000c,ind))
    ;
  }
  i = 0;
  do {
    sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)method);
    if (sVar3 <= i) {
      return (int)sVar3;
    }
    puVar4 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)method,i);
    BIO_printf((BIO *)trees,"%*s",(ulong)((int)bp + 2),"");
    gen = (GENERAL_NAME *)*puVar4;
    if (gen->type == 7) {
      pAVar2 = ((gen->d).ediPartyName)->partyName;
      iVar5 = *(int *)&((gen->d).ediPartyName)->nameAssigner;
      BIO_puts((BIO *)trees,"IP:");
      if (iVar5 == 8) {
        BIO_printf((BIO *)trees,"%d.%d.%d.%d/%d.%d.%d.%d",(ulong)(byte)pAVar2->length,
                   (ulong)*(byte *)((long)&pAVar2->length + 1),
                   (ulong)*(byte *)((long)&pAVar2->length + 2),
                   (ulong)*(byte *)((long)&pAVar2->length + 3),(ulong)(byte)pAVar2->type,
                   (ulong)*(byte *)((long)&pAVar2->type + 1),
                   (ulong)*(byte *)((long)&pAVar2->type + 2),
                   (ulong)*(byte *)((long)&pAVar2->type + 3));
      }
      else if (iVar5 == 0x20) {
        for (lVar6 = 0; iVar5 = (int)lVar6, iVar5 != 0x10; lVar6 = lVar6 + 1) {
          uVar1 = *(ushort *)((long)&pAVar2->length + lVar6 * 2);
          BIO_printf((BIO *)trees,"%X",(ulong)(ushort)(uVar1 << 8 | uVar1 >> 8));
          buf = "/";
          if (iVar5 == 7) {
LAB_00205e58:
            BIO_puts((BIO *)trees,buf);
          }
          else if (iVar5 != 0xf) {
            buf = ":";
            goto LAB_00205e58;
          }
        }
      }
      else {
        BIO_printf((BIO *)trees,"IP Address:<invalid>");
      }
    }
    else {
      GENERAL_NAME_print((BIO *)trees,gen);
    }
    BIO_puts((BIO *)trees,"\n");
    i = i + 1;
  } while( true );
}

Assistant:

static int do_i2r_name_constraints(const X509V3_EXT_METHOD *method,
                                   STACK_OF(GENERAL_SUBTREE) *trees, BIO *bp,
                                   int ind, const char *name) {
  GENERAL_SUBTREE *tree;
  size_t i;
  if (sk_GENERAL_SUBTREE_num(trees) > 0) {
    BIO_printf(bp, "%*s%s:\n", ind, "", name);
  }
  for (i = 0; i < sk_GENERAL_SUBTREE_num(trees); i++) {
    tree = sk_GENERAL_SUBTREE_value(trees, i);
    BIO_printf(bp, "%*s", ind + 2, "");
    if (tree->base->type == GEN_IPADD) {
      print_nc_ipadd(bp, tree->base->d.ip);
    } else {
      GENERAL_NAME_print(bp, tree->base);
    }
    BIO_puts(bp, "\n");
  }
  return 1;
}